

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O3

void amrex::computeGradient(MultiFab *grad,Array<const_MultiFab_*,_3> *umac,Geometry *geom)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  Real dzi;
  Real dyi;
  Real dxi;
  MFIter mfi;
  Box local_1ac;
  Array4<double> local_190;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  dVar1 = (geom->super_CoordSys).inv_dx[0];
  dVar2 = (geom->super_CoordSys).inv_dx[1];
  dVar3 = (geom->super_CoordSys).inv_dx[2];
  MFIter::MFIter(&local_90,(FabArrayBase *)grad,true);
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      MFIter::tilebox(&local_1ac,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_190,&grad->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_d0,&umac->_M_elems[0]->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,&umac->_M_elems[1]->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_150,&umac->_M_elems[2]->super_FabArray<amrex::FArrayBox>,&local_90);
      if (local_1ac.smallend.vect[2] <= local_1ac.bigend.vect[2]) {
        lVar8 = (long)local_1ac.smallend.vect[0] * 8;
        iVar9 = local_1ac.smallend.vect[2];
        do {
          if (local_1ac.smallend.vect[1] <= local_1ac.bigend.vect[1]) {
            lVar13 = (long)local_190.begin.x;
            lVar5 = (iVar9 - local_110.begin.z) * local_110.kstride * 8 +
                    (long)local_110.begin.x * -8 + lVar8;
            lVar12 = (iVar9 - local_190.begin.z) * local_190.kstride;
            lVar11 = (long)local_1ac.smallend.vect[1];
            do {
              iVar4 = (int)lVar11;
              if (local_1ac.smallend.vect[0] <= local_1ac.bigend.vect[0]) {
                lVar6 = (lVar11 - local_d0.begin.y) * local_d0.jstride * 8 +
                        (iVar9 - local_d0.begin.z) * local_d0.kstride * 8 +
                        (long)local_d0.begin.x * -8 + lVar8;
                lVar7 = (lVar11 - local_190.begin.y) * local_190.jstride * 8;
                lVar10 = (lVar11 - local_150.begin.y) * local_150.jstride * 8;
                lVar14 = 0;
                do {
                  *(double *)
                   ((long)local_190.p + lVar14 * 8 + lVar7 + lVar12 * 8 + lVar13 * -8 + lVar8) =
                       (*(double *)((long)local_d0.p + lVar14 * 8 + lVar6 + 8) -
                       *(double *)((long)local_d0.p + lVar14 * 8 + lVar6)) * dVar1;
                  *(double *)
                   ((long)local_190.p +
                   lVar14 * 8 + lVar7 + local_190.nstride * 8 + lVar12 * 8 + lVar13 * -8 + lVar8) =
                       (*(double *)
                         ((long)local_110.p +
                         lVar14 * 8 +
                         (long)((iVar4 + 1) - local_110.begin.y) * local_110.jstride * 8 + lVar5) -
                       *(double *)
                        ((long)local_110.p +
                        lVar14 * 8 + (lVar11 - local_110.begin.y) * local_110.jstride * 8 + lVar5))
                       * dVar2;
                  *(double *)
                   ((long)local_190.p +
                   lVar14 * 8 + lVar7 + local_190.nstride * 0x10 + lVar12 * 8 + lVar13 * -8 + lVar8)
                       = (*(double *)
                           ((long)local_150.p +
                           lVar14 * 8 +
                           lVar10 + local_150.kstride * 8 * (long)((iVar9 + 1) - local_150.begin.z)
                                    + (long)local_150.begin.x * -8 + lVar8) -
                         *(double *)
                          ((long)local_150.p +
                          lVar14 * 8 +
                          lVar10 + (long)(iVar9 - local_150.begin.z) * local_150.kstride * 8 +
                                   (long)local_150.begin.x * -8 + lVar8)) * dVar3;
                  lVar14 = lVar14 + 1;
                } while ((local_1ac.bigend.vect[0] - local_1ac.smallend.vect[0]) + 1 != (int)lVar14)
                ;
              }
              lVar11 = lVar11 + 1;
            } while (iVar4 + 1 != local_1ac.bigend.vect[1] + 1);
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 != local_1ac.bigend.vect[2] + 1);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void computeGradient (MultiFab& grad,  const Array<MultiFab const*,AMREX_SPACEDIM>& umac,
                          const Geometry& geom)
    {
        AMREX_ASSERT(grad.nComp() >= AMREX_SPACEDIM);

#if (AMREX_SPACEDIM==2)
        const auto& ba = grad.boxArray();
        const auto& dm = grad.DistributionMap();
        MultiFab volume, areax, areay;
        if (geom.IsRZ()) {
            geom.GetVolume(volume, ba, dm, 0);
            geom.GetFaceArea(areax, ba, dm, 0, 0);
            geom.GetFaceArea(areay, ba, dm, 1, 0);
        }
#endif

        const GpuArray<Real,AMREX_SPACEDIM> dxinv = geom.InvCellSizeArray();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(grad,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            const auto& gradfab = grad.array(mfi);
            AMREX_D_TERM(const auto& ufab = umac[0]->const_array(mfi);,
                         const auto& vfab = umac[1]->const_array(mfi);,
                         const auto& wfab = umac[2]->const_array(mfi););
#if (AMREX_SPACEDIM==2)
            if (geom.IsRZ()) {
                Array4<Real const> const&  ax =  areax.array(mfi);
                Array4<Real const> const&  ay =  areay.array(mfi);
                Array4<Real const> const& vol = volume.array(mfi);

                AMREX_LAUNCH_HOST_DEVICE_LAMBDA (bx, tbx,
                {
                    amrex_compute_gradient_rz(tbx,gradfab,AMREX_D_DECL(ufab,vfab,wfab),ax,ay,vol);
                });
            } else
#endif
            {
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA (bx, tbx,
                {
                    amrex_compute_gradient(tbx,gradfab,AMREX_D_DECL(ufab,vfab,wfab),dxinv);
                });
            }
        }
    }